

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSTEI_HRR_Writer.cpp
# Opt level: O0

void __thiscall
OSTEI_HRR_Writer::WriteBraSteps_
          (OSTEI_HRR_Writer *this,ostream *os,HRRDoubletStepList *steps,string *tag,
          string *ncart_ket,string *ketstr)

{
  Doublet *pDVar1;
  bool bVar2;
  ostream *poVar3;
  string *in_RCX;
  undefined8 in_RDX;
  Doublet *in_RSI;
  string *in_R8;
  char *sign;
  Doublet src1;
  Doublet src0;
  Doublet target;
  HRRDoubletStep *it;
  const_iterator __end1;
  const_iterator __begin1;
  HRRDoubletStepList *__range1;
  Doublet *in_stack_fffffffffffffe08;
  Doublet *in_stack_fffffffffffffe10;
  string local_1b0 [32];
  string local_190 [32];
  string local_170 [39];
  allocator local_149;
  string local_148 [24];
  string *in_stack_fffffffffffffed0;
  char *ncart_ket_00;
  Doublet *in_stack_fffffffffffffee0;
  OSTEI_HRR_Writer *in_stack_fffffffffffffee8;
  string local_100 [80];
  string local_b0 [64];
  string local_70 [32];
  reference local_50;
  HRRDoubletStep *local_48;
  __normal_iterator<const_HRRDoubletStep_*,_std::vector<HRRDoubletStep,_std::allocator<HRRDoubletStep>_>_>
  local_40;
  undefined8 local_38;
  string *local_28;
  string *local_20;
  undefined8 local_18;
  Doublet *local_10;
  
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  poVar3 = std::operator<<((ostream *)in_RSI,(string *)indent4_abi_cxx11_);
  poVar3 = std::operator<<(poVar3,"for(iket = 0; iket < ");
  poVar3 = std::operator<<(poVar3,local_28);
  std::operator<<(poVar3,"; ++iket)\n");
  poVar3 = std::operator<<((ostream *)local_10,(string *)indent4_abi_cxx11_);
  std::operator<<(poVar3,"{\n");
  local_38 = local_18;
  local_40._M_current =
       (HRRDoubletStep *)
       std::vector<HRRDoubletStep,_std::allocator<HRRDoubletStep>_>::begin
                 ((vector<HRRDoubletStep,_std::allocator<HRRDoubletStep>_> *)
                  in_stack_fffffffffffffe08);
  local_48 = (HRRDoubletStep *)
             std::vector<HRRDoubletStep,_std::allocator<HRRDoubletStep>_>::end
                       ((vector<HRRDoubletStep,_std::allocator<HRRDoubletStep>_> *)
                        in_stack_fffffffffffffe08);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_HRRDoubletStep_*,_std::vector<HRRDoubletStep,_std::allocator<HRRDoubletStep>_>_>
                        *)in_stack_fffffffffffffe10,
                       (__normal_iterator<const_HRRDoubletStep_*,_std::vector<HRRDoubletStep,_std::allocator<HRRDoubletStep>_>_>
                        *)in_stack_fffffffffffffe08);
    if (!bVar2) break;
    local_50 = __gnu_cxx::
               __normal_iterator<const_HRRDoubletStep_*,_std::vector<HRRDoubletStep,_std::allocator<HRRDoubletStep>_>_>
               ::operator*(&local_40);
    Doublet::Doublet(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
    std::array<Doublet,_2UL>::operator[]
              ((array<Doublet,_2UL> *)in_stack_fffffffffffffe10,(size_type)in_stack_fffffffffffffe08
              );
    Doublet::Doublet(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
    std::array<Doublet,_2UL>::operator[]
              ((array<Doublet,_2UL> *)in_stack_fffffffffffffe10,(size_type)in_stack_fffffffffffffe08
              );
    Doublet::Doublet(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
    std::__cxx11::string::operator=(local_70,local_20);
    std::__cxx11::string::operator=(local_b0,local_20);
    std::__cxx11::string::operator=(local_100,local_20);
    pDVar1 = local_10;
    ncart_ket_00 = " + ";
    if (local_50->type == I) {
      ncart_ket_00 = " - ";
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_148,0x14,' ',&local_149);
    std::operator<<((ostream *)pDVar1,local_148);
    std::__cxx11::string::~string(local_148);
    std::allocator<char>::~allocator((allocator<char> *)&local_149);
    pDVar1 = local_10;
    HRRBraStepVar_(in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,(string *)ncart_ket_00,
                   in_stack_fffffffffffffed0);
    std::operator<<((ostream *)pDVar1,local_170);
    std::__cxx11::string::~string(local_170);
    std::operator<<((ostream *)local_10," = ");
    pDVar1 = local_10;
    HRRBraStepVar_(in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,(string *)ncart_ket_00,
                   in_stack_fffffffffffffed0);
    std::operator<<((ostream *)pDVar1,local_190);
    std::__cxx11::string::~string(local_190);
    poVar3 = std::operator<<((ostream *)local_10,ncart_ket_00);
    poVar3 = std::operator<<(poVar3,"( hAB[");
    in_stack_fffffffffffffe10 = (Doublet *)std::ostream::operator<<(poVar3,local_50->xyz);
    std::operator<<((ostream *)in_stack_fffffffffffffe10,"] * ");
    in_stack_fffffffffffffe08 = local_10;
    HRRBraStepVar_(in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,(string *)ncart_ket_00,
                   in_stack_fffffffffffffed0);
    std::operator<<((ostream *)in_stack_fffffffffffffe08,local_1b0);
    std::__cxx11::string::~string(local_1b0);
    std::operator<<((ostream *)local_10," );");
    std::operator<<((ostream *)local_10,"\n\n");
    Doublet::~Doublet((Doublet *)0x14b085);
    Doublet::~Doublet((Doublet *)0x14b092);
    Doublet::~Doublet((Doublet *)0x14b09f);
    __gnu_cxx::
    __normal_iterator<const_HRRDoubletStep_*,_std::vector<HRRDoubletStep,_std::allocator<HRRDoubletStep>_>_>
    ::operator++(&local_40);
  }
  poVar3 = std::operator<<((ostream *)local_10,(string *)indent4_abi_cxx11_);
  std::operator<<(poVar3,"}\n");
  std::operator<<((ostream *)local_10,"\n");
  return;
}

Assistant:

void OSTEI_HRR_Writer::WriteBraSteps_(std::ostream & os, const HRRDoubletStepList & steps,
                                      const std::string & tag,
                                      const std::string & ncart_ket, const std::string & ketstr) const
{
    os << indent4 << "for(iket = 0; iket < " << ncart_ket << "; ++iket)\n";
    os << indent4 << "{\n";

    for(const auto & it : steps)
    {
        //os << std::string(20, ' ') << "// " << it << "\n";

        // add the appropriate integral tags
        Doublet target(it.target);
        Doublet src0(it.src[0]);
        Doublet src1(it.src[1]);
        target.tag = tag;
        src0.tag = tag;
        src1.tag = tag;
    
        const char * sign = " + ";
        if(it.type == RRStepType::I) // moving from J->I
            sign = " - ";

        os << std::string(20, ' ');

        os << HRRBraStepVar_(target, ncart_ket, ketstr);

        os << " = ";
        os << HRRBraStepVar_(src0, ncart_ket, ketstr);
        os << sign << "( hAB[" << static_cast<int>(it.xyz) << "] * ";
        os << HRRBraStepVar_(src1, ncart_ket, ketstr);
        os << " );";
        os << "\n\n";
    }

    os << indent4 << "}\n";
    os << "\n";
}